

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

ssize_t writen(int fd,string *sbuff)

{
  ssize_t sVar1;
  int *piVar2;
  size_type __pos;
  size_type __n;
  pointer __buf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __buf = (sbuff->_M_dataplus)._M_p;
  __n = sbuff->_M_string_length;
  __pos = 0;
  do {
    while( true ) {
      sVar1 = write(fd,__buf,__n);
      if (sVar1 < 0) break;
      __pos = __pos + sVar1;
      __n = __n - sVar1;
      __buf = __buf + sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*piVar2 == 0xb) {
    if (__pos == (long)(int)sbuff->_M_string_length) {
      sbuff->_M_string_length = 0;
      *(sbuff->_M_dataplus)._M_p = '\0';
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                (&local_48,sbuff,__pos,0xffffffffffffffff);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (sbuff,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    __pos = 0xffffffffffffffff;
  }
  return __pos;
}

Assistant:

ssize_t writen(int fd, std::string &sbuff){
    size_t nleft=sbuff.size();
    ssize_t nwriten=0;
    ssize_t writeSum=0;
    const char* ptr=sbuff.c_str();

    while (true) {
        if((nwriten=write(fd, ptr, nleft))<=0){
            if (nwriten<0) {
                if(errno==EINTR){
                    nwriten=0;
                    continue;
                }else if (errno==EAGAIN) {
                    break;
                }else {
                    return -1;
                }
            }
        }
        writeSum+=nwriten;
        nleft-=nwriten;
        ptr+=nwriten;
    }

    if (writeSum==static_cast<int>(sbuff.size())) {
        sbuff.clear();
    }else {
        sbuff=sbuff.substr(writeSum);
    }
    return writeSum;
}